

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_urlencode.cpp
# Opt level: O1

string * urlencode(string *__return_storage_ptr__,string *c)

{
  byte bVar1;
  pointer pcVar2;
  uint uVar3;
  ulong uVar4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = (uint)c->_M_string_length;
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      pcVar2 = (c->_M_dataplus)._M_p;
      bVar1 = pcVar2[uVar4];
      if (((((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
          (bVar1 - 0x2d < 2)) || ((bVar1 == 0x7e || (bVar1 == 0x5f)))) {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)(pcVar2 + uVar4));
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        char2hex_abi_cxx11_(&local_50,(c->_M_dataplus)._M_p[uVar4]);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string urlencode( const std::string c)
{ 
	std::string escaped;
	int max = c.length();
	for(int i=0; i<max; i++)
	{
		if ( (48 <= c[i] && c[i] <= 57) ||   //0-9
			(65 <= c[i] && c[i] <= 90) ||      //ABC...XYZ
			(97 <= c[i] && c[i] <= 122) ||     //abc...xyz
			(c[i]=='~' || c[i]=='-' || c[i]=='_' || c[i]=='.')
			)
		{
			escaped.append( &c[i], 1);
		}
		else
		{
			escaped.append("%");
			escaped.append( char2hex(c[i]) );//converts char 255 to string "FF"
		}
	}
	return escaped;
}